

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O1

bool FinalizeAndExtractPSBT(PartiallySignedTransaction *psbtx,CMutableTransaction *result)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  bool bVar4;
  pointer pCVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = FinalizePSBT(psbtx);
  if (bVar4) {
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator=
              (&result->vin,(vector<CTxIn,_std::allocator<CTxIn>_> *)psbtx);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator=
              (&result->vout,
               &(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout);
    uVar2 = *(undefined8 *)
             ((long)&(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                     super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                     super__Optional_payload_base<CMutableTransaction>._M_payload + 0x30);
    result->version = (int)uVar2;
    result->nLockTime = (int)((ulong)uVar2 >> 0x20);
    pCVar5 = (result->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((result->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
        super__Vector_impl_data._M_finish != pCVar5) {
      uVar6 = 0;
      uVar7 = 1;
      do {
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&pCVar5[uVar6].scriptSig.super_CScriptBase,
                   &(psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar6].final_script_sig.
                    super_CScriptBase);
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::operator=(&(result->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar6].scriptWitness.stack,
                    &(psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar6].final_script_witness.stack);
        pCVar5 = (result->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = ((long)(result->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar5 >> 3) * 0x4ec4ec4ec4ec4ec5;
        bVar8 = uVar7 <= uVar6;
        lVar3 = uVar6 - uVar7;
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar8 && lVar3 != 0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool FinalizeAndExtractPSBT(PartiallySignedTransaction& psbtx, CMutableTransaction& result)
{
    // It's not safe to extract a PSBT that isn't finalized, and there's no easy way to check
    //   whether a PSBT is finalized without finalizing it, so we just do this.
    if (!FinalizePSBT(psbtx)) {
        return false;
    }

    result = *psbtx.tx;
    for (unsigned int i = 0; i < result.vin.size(); ++i) {
        result.vin[i].scriptSig = psbtx.inputs[i].final_script_sig;
        result.vin[i].scriptWitness = psbtx.inputs[i].final_script_witness;
    }
    return true;
}